

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::DoSimdBitmask<wabt::interp::Simd<short,(unsigned_char)8>>(Thread *this)

{
  u8 i;
  long lVar1;
  uint uVar2;
  uint value;
  Simd<short,_(unsigned_char)__b_> SVar3;
  Simd<short,_(unsigned_char)__b_> val;
  short local_18 [8];
  
  SVar3 = Pop<wabt::interp::Simd<short,(unsigned_char)8>>(this);
  local_18[0] = SVar3.v[0];
  local_18[1] = SVar3.v[1];
  local_18[2] = SVar3.v[2];
  local_18[3] = SVar3.v[3];
  local_18[4] = SVar3.v[4];
  local_18[5] = SVar3.v[5];
  local_18[6] = SVar3.v[6];
  local_18[7] = SVar3.v[7];
  lVar1 = 0;
  value = 0;
  do {
    uVar2 = 1 << ((byte)lVar1 & 0x1f);
    if (-1 < local_18[lVar1]) {
      uVar2 = 0;
    }
    value = value | uVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  Push<unsigned_int>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBitmask() {
  auto val = Pop<S>();
  u32 result = 0;
  for (u8 i = 0; i < S::lanes; ++i) {
    if (val[i] < 0) {
      result |= 1 << i;
    }
  }
  Push(result);
  return RunResult::Ok;
}